

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O2

int Abc_NtkRenodeEvalAig(If_Man_t *p,If_Cut_t *pCut)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint *pTruth;
  Kit_Graph_t *pGraph;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  lVar1 = (ulong)(byte)pCut->field_0x1f * 4;
  pTruth = If_CutTruth(p,pCut);
  pGraph = Kit_TruthToGraph(pTruth,(uint)(byte)pCut->field_0x1f,s_vMemory);
  if (pGraph == (Kit_Graph_t *)0x0) {
    bVar2 = pCut->field_0x1f;
    for (uVar6 = 0; bVar2 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined1 *)((long)&pCut[1].Area + uVar6 + lVar1) = 100;
    }
    iVar5 = 0xfff;
  }
  else {
    iVar3 = pGraph->nLeaves;
    iVar5 = pGraph->nSize;
    lVar7 = 0;
    for (uVar6 = 0; uVar6 < (byte)pCut->field_0x1f; uVar6 = uVar6 + 1) {
      iVar4 = Kit_GraphLeafDepth_rec
                        (pGraph,pGraph->pNodes + (long)pGraph->nSize + -1,
                         (Kit_Node_t *)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar7));
      *(char *)((long)&pCut[1].Area + uVar6 + lVar1) = (char)iVar4;
      lVar7 = lVar7 + 0x18;
    }
    iVar5 = iVar5 - iVar3;
    Kit_GraphFree(pGraph);
  }
  return iVar5;
}

Assistant:

int Abc_NtkRenodeEvalAig( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    Kit_Graph_t * pGraph;
    int i, nNodes;
    pGraph = Kit_TruthToGraph( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory );
    if ( pGraph == NULL )
    {
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pPerm[i] = 100;
        return IF_COST_MAX;
    }
    nNodes = Kit_GraphNodeNum( pGraph );
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeLast(pGraph), Kit_GraphNode(pGraph, i) );
    Kit_GraphFree( pGraph );
    return nNodes;
}